

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

Result __thiscall tonk::SessionOutgoing::PostRecovery(SessionOutgoing *this,int *bytesSentOut)

{
  Lock *this_00;
  int *piVar1;
  SimpleCipher *this_01;
  undefined4 uVar2;
  undefined8 *puVar3;
  long lVar4;
  uint8_t *data;
  uint16_t uVar5;
  SiameseResult SVar6;
  _func_int **pp_Var7;
  OutputWorker *this_02;
  uint8_t *puVar8;
  NonceT sequence;
  undefined6 extraout_var;
  uint64_t uVar9;
  int *in_RDX;
  byte bVar10;
  byte bVar11;
  ulong __n;
  uint uVar12;
  uint bytes;
  int iVar13;
  allocator local_221;
  ulong local_220;
  uint8_t *local_218;
  SimpleCipher *local_210;
  uint8_t *local_208;
  uint8_t *local_200;
  Lock *local_1f8;
  SessionOutgoing *local_1f0;
  SiameseRecoveryPacket recovery;
  uint nonceBytes;
  Level local_1b0;
  ostringstream local_1a8 [376];
  
  *in_RDX = 0;
  if ((*(byte *)(bytesSentOut + 0xa9) & 1) == 0) {
    puVar3 = *(undefined8 **)(bytesSentOut + 0x82);
    if (*(int *)(puVar3 + 1) < 4) {
      _nonceBytes = (Lock *)*puVar3;
      local_1b0 = Warning;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,(string *)(puVar3 + 7));
      std::operator<<((ostream *)local_1a8,"PostRecovery ignored before peer address is known");
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,(LogStringBuffer *)&nonceBytes);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
  }
  else {
    SVar6 = siamese_encode(*(SiameseEncoder *)(bytesSentOut + 0xb4),&recovery);
    if (SVar6 == Siamese_Success) {
      this_00 = (Lock *)(bytesSentOut + 2);
      uVar12 = recovery.DataBytes + 0x30;
      _nonceBytes = this_00;
      std::recursive_mutex::lock((recursive_mutex *)this_00);
      puVar8 = pktalloc::Allocator::Allocate((Allocator *)(bytesSentOut + 0xc),uVar12);
      Locker::~Locker((Locker *)&nonceBytes);
      if (puVar8 == (uint8_t *)0x0) {
        Result::OutOfMemory();
        return (Result)(ErrorResult *)this;
      }
      __n = (ulong)recovery.DataBytes;
      local_218 = puVar8 + 0x10;
      local_1f0 = this;
      memcpy(local_218,recovery.Data,__n);
      iVar13 = bytesSentOut[0x1868];
      local_220 = __n;
      local_200 = puVar8;
      sequence = writeNonce((SessionOutgoing *)bytesSentOut,puVar8 + __n + 0x10,&nonceBytes);
      data = local_218;
      local_208 = puVar8 + __n + 0x10 + ((ulong)_nonceBytes & 0xffffffff);
      bVar10 = (char)_nonceBytes * '\x04' | (char)iVar13 << 5;
      bVar11 = bVar10 | 0x90;
      if ((*(byte *)(bytesSentOut + 0xb6) & 1) != 0) {
        uVar2 = *(undefined4 *)((long)bytesSentOut + 0x2e1);
        bVar11 = bVar10 | 0xd0;
        *(undefined8 *)local_208 = *(undefined8 *)((long)bytesSentOut + 0x2d9);
        *(undefined4 *)(local_208 + 8) = uVar2;
        local_208 = local_208 + 0xc;
      }
      this_01 = (SimpleCipher *)(bytesSentOut + 0x8a);
      local_208[3] = bVar11;
      bytes = (int)local_208 - (int)local_218;
      uVar12 = (uint)local_220;
      local_220 = sequence;
      local_210 = this_01;
      local_1f8 = this_00;
      security::SimpleCipher::Cipher(this_01,local_218,uVar12,sequence);
      uVar5 = security::SimpleCipher::Tag(this_01,data,bytes,local_220);
      local_220 = CONCAT44(local_220._4_4_,(int)CONCAT62(extraout_var,uVar5));
      iVar13 = bytes + 6;
      uVar9 = siamese::GetTimeUsec();
      uVar5 = security::SimpleCipher::TagInt(local_210,(uint)bVar11 | (int)(uVar9 >> 3) << 8);
      local_208[2] = (uint8_t)(uVar9 >> 0x13);
      *(short *)local_208 = (short)(uVar9 >> 3);
      *(uint16_t *)(local_208 + 4) = uVar5 ^ (ushort)local_220;
      (**(code **)(**(long **)(bytesSentOut + 0x84) + 0x10))
                (*(long **)(bytesSentOut + 0x84),bytesSentOut + 0xa2,
                 *(undefined8 *)(bytesSentOut + 0x86));
      lVar4 = *(long *)(bytesSentOut + 0x88);
      LOCK();
      piVar1 = (int *)(lVar4 + 0x18);
      *piVar1 = *piVar1 - iVar13;
      UNLOCK();
      piVar1 = (int *)(lVar4 + 0x58);
      *piVar1 = *piVar1 + iVar13;
      *in_RDX = iVar13;
      this = local_1f0;
    }
    else if (SVar6 != Siamese_NeedMoreData) {
      std::__cxx11::string::string((string *)&nonceBytes,"siamese_encode failed",&local_221);
      pp_Var7 = (_func_int **)operator_new(0x38);
      *pp_Var7 = (_func_int *)"SessionOutgoing::PostRecovery";
      std::__cxx11::string::string((string *)(pp_Var7 + 1),(string *)&nonceBytes);
      *(undefined4 *)(pp_Var7 + 5) = 1;
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var7;
      pp_Var7[6] = (_func_int *)(long)(int)SVar6;
      std::__cxx11::string::~string((string *)&nonceBytes);
      return (Result)(ErrorResult *)this;
    }
  }
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::PostRecovery(int& bytesSentOut)
{
    bytesSentOut = 0;

    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostRecovery ignored before peer address is known");
        return Result::Success();
    }

    // Generate a recovery packet using the Siamese FEC library.
    // The recovery data is only valid until the next call to siamese_encode()
    SiameseRecoveryPacket recovery;
    const int encodeResult = siamese_encode(FECEncoder, &recovery);

    if (encodeResult == Siamese_NeedMoreData) {
        return Result::Success();
    }

    if (encodeResult != Siamese_Success) {
        return Result("SessionOutgoing::PostRecovery", "siamese_encode failed", ErrorType::Siamese, encodeResult);
    }

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + recovery.DataBytes + protocol::kMaxOverheadBytes);
    if (!datagram) {
        return Result::OutOfMemory();
    }

    // No need to call Initialize on the OutgoingQueuedDatagram object

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = recovery.DataBytes;

    /*
        This memory allocation and copy cannot be trivially eliminated.
        Hopefully it won't show up on a CPU profiler.

        I started working on it in the Siamese scratch-space branch.
        The problem is that the send timer does not tick fast enough to keep up
        with data rates above 1 MB/s, assuming that Asio completes one send per
        tick.  Tonk must queue up multiple FEC Recovery Datagrams per tick.
    */
    memcpy(datagramData, recovery.Data, messageBytes);

    // The following code must be kept in sync with sendQueuedDatagram().
    // It is inlined and optimized for this common case:

    // No random padding

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kOnlyFECMask | protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    // No reliable sequence number

    // Write packet nonce to header
    unsigned nonceBytes;
    NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Prepare tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    stats->Stats[Stats_SiameseBytesSent] += messageBytes; // Flags bit means no message frame header
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    const unsigned kCompressionSavings = 0;
    const bool kNotReliable = false;

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        kCompressionSavings,
        sendBytes,
        kNotReliable);

    // Report number of bytes sent
    bytesSentOut = static_cast<int>(sendBytes);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    ++m_Recovery;
    Deps.Logger->Info("Recovery sent. Current send rate = ", (float)m_Recovery / (float)m_Reliable);
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return Result::Success();
}